

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Http.cpp
# Opt level: O2

void __thiscall asl::HttpMessage::readHeaders(HttpMessage *this)

{
  bool bVar1;
  int iVar2;
  anon_union_16_2_78e7fdac_for_String_2 *paVar3;
  String line;
  String local_90;
  String headerName;
  String headerValue;
  String local_48;
  
  headerName._size = 0;
  headerName._len = 0;
  headerValue._size = 0;
  headerValue._len = 0;
  headerName.field_2._space[0] = '\0';
  headerValue.field_2._space[0] = '\0';
  line.field_2._space[0] = '\0';
  line._size = 0;
  line._len = 0;
LAB_001284ef:
  do {
    Socket::readLine(&local_90,this->_socket);
    String::operator=(&line,&local_90);
    bVar1 = String::operator!=(&line,"\r");
    String::~String(&local_90);
    if (!bVar1) {
LAB_00128623:
      String::~String(&line);
      String::~String(&headerValue);
      String::~String(&headerName);
      return;
    }
    paVar3 = &line.field_2;
    if (line._size != 0) {
      paVar3 = (anon_union_16_2_78e7fdac_for_String_2 *)
               CONCAT71(line.field_2._1_7_,line.field_2._space[0]);
    }
    iVar2 = isspace((int)paVar3->_space[0]);
    if (iVar2 != 0) {
      String::trimmed(&local_48,&line);
      String::operator+(&local_90,&headerValue,&local_48);
      setHeader(this,&headerName,&local_90);
      String::~String(&local_90);
      String::~String(&local_48);
      goto LAB_001284ef;
    }
    String::trim(&line);
    iVar2 = String::indexOf(&line,':',0);
    if (iVar2 < 0) {
      (*((this->_socket->super_SmartObject)._p)->_vptr_SmartObject_[0xb])();
      goto LAB_00128623;
    }
    String::substring(&local_90,&line,0,iVar2);
    String::operator=(&headerName,&local_90);
    String::~String(&local_90);
    if (iVar2 < line._len + -1) {
      String::substring(&local_90,&line,iVar2 + 2);
    }
    else {
      local_90.field_2._space[0] = '\0';
      local_90._size = 0;
      local_90._len = 0;
    }
    String::operator=(&headerValue,&local_90);
    String::~String(&local_90);
    setHeader(this,&headerName,&headerValue);
  } while( true );
}

Assistant:

void HttpMessage::readHeaders()
{
	String headerName, headerValue, line;

	while (line = _socket->readLine(), line != "\r")
	{
		if (isspace(line[0])) // multiline
		{
			setHeader(headerName, headerValue + line.trimmed());
			continue;
		}
		line.trim();
		int i = line.indexOf(':');
		if (i<0) {
			_socket->close();
			return;
		}
		headerName = line.substring(0, i);
		headerValue = (i < line.length() - 1) ? line.substring(i + 2) : String();
		setHeader(headerName, headerValue);
	}
}